

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_sendmsg(uv_udp_t *handle)

{
  int iVar1;
  uint *__s;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  ulong local_540;
  size_t i;
  size_t pkts;
  ssize_t npkts;
  uv__queue *q;
  mmsghdr *p;
  mmsghdr h [20];
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  iVar1 = uv__queue_empty(&handle->write_queue);
  if (iVar1 == 0) {
    do {
      i = 0;
      for (npkts = (ssize_t)uv__queue_head(&handle->write_queue);
          i < 0x14 && (uv__queue *)npkts != &handle->write_queue;
          npkts = (ssize_t)uv__queue_head((uv__queue *)npkts)) {
        if (npkts == 0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                        ,0x127,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        h[0x13]._56_8_ = npkts + -0x58;
        if (h[0x13]._56_8_ == 0) {
          __assert_fail("req != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                        ,0x129,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        __s = &h[i - 1].msg_len;
        memset(__s,0,0x40);
        if (*(short *)(h[0x13]._56_8_ + 0x68) == 0) {
          *(undefined8 *)__s = 0;
          *(undefined4 *)&h[i].msg_hdr.msg_name = 0;
        }
        else {
          *(long *)__s = h[0x13]._56_8_ + 0x68;
          if (*(short *)(h[0x13]._56_8_ + 0x68) == 10) {
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x1c;
          }
          else if (*(short *)(h[0x13]._56_8_ + 0x68) == 2) {
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x10;
          }
          else {
            if (*(short *)(h[0x13]._56_8_ + 0x68) != 1) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                            ,0x139,"void uv__udp_sendmsg(uv_udp_t *)");
            }
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x6e;
          }
        }
        *(undefined8 *)&h[i].msg_hdr.msg_namelen = *(undefined8 *)(h[0x13]._56_8_ + 0xf0);
        h[i].msg_hdr.msg_iov = (iovec *)(ulong)*(uint *)(h[0x13]._56_8_ + 0xe8);
        i = i + 1;
      }
      do {
        iVar1 = sendmmsg((handle->io_watcher).fd,&p,i & 0xffffffff,0);
        uVar2 = (ulong)iVar1;
        bVar4 = false;
        if (uVar2 == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if ((long)uVar2 < 1) {
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 0x69) {
          return;
        }
        local_540 = 0;
        npkts = (ssize_t)uv__queue_head(&handle->write_queue);
        while( true ) {
          if (i <= local_540 || (uv__queue *)npkts == &handle->write_queue) {
            uv__io_feed(handle->loop,&handle->io_watcher);
            return;
          }
          if (npkts == 0) break;
          h[0x13]._56_8_ = npkts + -0x58;
          if (h[0x13]._56_8_ == 0) {
            __assert_fail("req != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                          ,0x14d,"void uv__udp_sendmsg(uv_udp_t *)");
          }
          piVar3 = __errno_location();
          *(long *)(h[0x13]._56_8_ + 0xf8) = (long)-*piVar3;
          uv__queue_remove((uv__queue *)(h[0x13]._56_8_ + 0x58));
          uv__queue_insert_tail(&handle->write_completed_queue,(uv__queue *)(h[0x13]._56_8_ + 0x58))
          ;
          local_540 = local_540 + 1;
          npkts = (ssize_t)uv__queue_head(&handle->write_queue);
        }
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                      ,0x14b,"void uv__udp_sendmsg(uv_udp_t *)");
      }
      local_540 = 0;
      npkts = (ssize_t)uv__queue_head(&handle->write_queue);
      while (local_540 < uVar2 && (uv__queue *)npkts != &handle->write_queue) {
        if (npkts == 0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                        ,0x15d,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        h[0x13]._56_8_ = npkts + -0x58;
        if (h[0x13]._56_8_ == 0) {
          __assert_fail("req != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/udp.c"
                        ,0x15f,"void uv__udp_sendmsg(uv_udp_t *)");
        }
        *(undefined8 *)(npkts + 0xa0) = *(undefined8 *)(*(long *)(npkts + 0x98) + 8);
        uv__queue_remove((uv__queue *)npkts);
        uv__queue_insert_tail(&handle->write_completed_queue,(uv__queue *)(h[0x13]._56_8_ + 0x58));
        local_540 = local_540 + 1;
        npkts = (ssize_t)uv__queue_head(&handle->write_queue);
      }
      iVar1 = uv__queue_empty(&handle->write_queue);
    } while (iVar1 == 0);
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

static void uv__udp_sendmsg(uv_udp_t* handle) {
#if defined(__linux__) || defined(__FreeBSD__)
  uv_udp_send_t* req;
  struct mmsghdr h[20];
  struct mmsghdr* p;
  struct uv__queue* q;
  ssize_t npkts;
  size_t pkts;
  size_t i;

  if (uv__queue_empty(&handle->write_queue))
    return;

write_queue_drain:
  for (pkts = 0, q = uv__queue_head(&handle->write_queue);
       pkts < ARRAY_SIZE(h) && q != &handle->write_queue;
       ++pkts, q = uv__queue_head(q)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    p = &h[pkts];
    memset(p, 0, sizeof(*p));
    if (req->addr.ss_family == AF_UNSPEC) {
      p->msg_hdr.msg_name = NULL;
      p->msg_hdr.msg_namelen = 0;
    } else {
      p->msg_hdr.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h[pkts].msg_hdr.msg_iov = (struct iovec*) req->bufs;
    h[pkts].msg_hdr.msg_iovlen = req->nbufs;
  }

  do
    npkts = sendmmsg(handle->io_watcher.fd, h, pkts, 0);
  while (npkts == -1 && errno == EINTR);

  if (npkts < 1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return;
    for (i = 0, q = uv__queue_head(&handle->write_queue);
         i < pkts && q != &handle->write_queue;
         ++i, q = uv__queue_head(&handle->write_queue)) {
      assert(q != NULL);
      req = uv__queue_data(q, uv_udp_send_t, queue);
      assert(req != NULL);

      req->status = UV__ERR(errno);
      uv__queue_remove(&req->queue);
      uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    }
    uv__io_feed(handle->loop, &handle->io_watcher);
    return;
  }

  /* Safety: npkts known to be >0 below. Hence cast from ssize_t
   * to size_t safe.
   */
  for (i = 0, q = uv__queue_head(&handle->write_queue);
       i < (size_t)npkts && q != &handle->write_queue;
       ++i, q = uv__queue_head(&handle->write_queue)) {
    assert(q != NULL);
    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    req->status = req->bufs[0].len;

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
  }

  /* couldn't batch everything, continue sending (jump to avoid stack growth) */
  if (!uv__queue_empty(&handle->write_queue))
    goto write_queue_drain;
  uv__io_feed(handle->loop, &handle->io_watcher);
#else  /* __linux__ || ____FreeBSD__ */
  uv_udp_send_t* req;
  struct msghdr h;
  struct uv__queue* q;
  ssize_t size;

  while (!uv__queue_empty(&handle->write_queue)) {
    q = uv__queue_head(&handle->write_queue);
    assert(q != NULL);

    req = uv__queue_data(q, uv_udp_send_t, queue);
    assert(req != NULL);

    memset(&h, 0, sizeof h);
    if (req->addr.ss_family == AF_UNSPEC) {
      h.msg_name = NULL;
      h.msg_namelen = 0;
    } else {
      h.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        h.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        h.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        h.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h.msg_iov = (struct iovec*) req->bufs;
    h.msg_iovlen = req->nbufs;

    do {
      size = sendmsg(handle->io_watcher.fd, &h, 0);
    } while (size == -1 && errno == EINTR);

    if (size == -1) {
      if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
        break;
    }

    req->status = (size == -1 ? UV__ERR(errno) : size);

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    uv__queue_remove(&req->queue);
    uv__queue_insert_tail(&handle->write_completed_queue, &req->queue);
    uv__io_feed(handle->loop, &handle->io_watcher);
  }
#endif  /* __linux__ || ____FreeBSD__ */
}